

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_standard_tests.cpp
# Opt level: O3

void __thiscall
script_standard_tests::script_standard_ExtractDestination::test_method
          (script_standard_ExtractDestination *this)

{
  undefined4 uVar1;
  uint uVar2;
  CScript *data;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  element_type *peVar5;
  bool bVar6;
  readonly_property<bool> rVar7;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar8;
  variant_alternative_t<1UL,_variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *a;
  variant_alternative_t<2UL,_variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *pvVar9;
  allocator_type *paVar10;
  variant_alternative_t<5UL,_variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *pvVar11;
  CSHA256 *this_00;
  variant_alternative_t<4UL,_variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *pvVar12;
  void *__dest;
  variant_alternative_t<8UL,_variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *w1;
  undefined8 uVar13;
  uint uVar14;
  size_t len;
  size_type sVar15;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar16;
  iterator in_R8;
  iterator pvVar17;
  iterator in_R9;
  iterator pvVar18;
  size_t __n;
  ulong uVar19;
  long in_FS_OFFSET;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  span<const_std::byte,_18446744073709551615UL> b;
  const_string file;
  const_string file_00;
  span<const_std::byte,_18446744073709551615UL> b_00;
  const_string file_01;
  const_string file_02;
  span<const_std::byte,_18446744073709551615UL> b_01;
  const_string file_03;
  const_string file_04;
  span<const_std::byte,_18446744073709551615UL> b_02;
  const_string file_05;
  initializer_list<unsigned_char> __l;
  span<const_std::byte,_18446744073709551615UL> b_03;
  const_string file_06;
  span<const_std::byte,_18446744073709551615UL> b_04;
  const_string file_07;
  Span<unsigned_char> output;
  const_string file_08;
  span<const_std::byte,_18446744073709551615UL> b_05;
  const_string file_09;
  const_string file_10;
  span<const_std::byte,_18446744073709551615UL> b_06;
  const_string file_11;
  const_string file_12;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  WitnessV0ScriptHash scripthash;
  WitnessV0KeyHash keyhash;
  CTxDestination address;
  CPubKey pubkey;
  check_type cVar28;
  char *local_4b0;
  char *local_4a8;
  assertion_result local_4a0;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  undefined1 local_1f8 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_1f0;
  undefined1 local_1e8 [2];
  allocator_type aStack_1e6;
  allocator_type aStack_1e5;
  allocator_type aStack_1e4;
  allocator_type aStack_1e3;
  allocator_type aStack_1e2;
  allocator_type aStack_1e1;
  undefined1 auStack_1e0 [2];
  allocator_type aStack_1de;
  allocator_type aStack_1dd;
  allocator_type aStack_1dc;
  allocator_type aStack_1db;
  allocator_type aStack_1da;
  allocator_type aStack_1d9;
  shared_count local_1d8;
  char **local_1d0;
  assertion_result local_1c8;
  uchar uStack_1b0;
  uchar uStack_1af;
  uchar uStack_1ae;
  uchar uStack_1ad;
  uchar uStack_1ac;
  uchar uStack_1ab;
  uchar uStack_1aa;
  uchar uStack_1a9;
  undefined1 local_1a8 [8];
  pointer puStack_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  uint64_t local_148;
  undefined1 local_138 [16];
  undefined4 local_128;
  undefined1 local_118 [16];
  shared_count sStack_108;
  undefined8 local_100;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_f8;
  undefined1 local_b0;
  undefined1 local_a8 [28];
  uint uStack_8c;
  CPubKey local_79;
  long local_38;
  
  local_4a0.m_message.pn.pi_ = (sp_counted_base *)local_4a0.m_message.px;
  local_1d8.pi_ = (sp_counted_base *)_auStack_1e0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  GenerateRandomKey(SUB81((CKey *)local_1f8,0));
  CKey::GetPubKey(&local_79,(CKey *)local_1f8);
  stack0xffffffffffffff68 = (undefined1  [16])0x0;
  local_a8._0_16_ = (undefined1  [16])0x0;
  local_f8._16_16_ = (undefined1  [16])0x0;
  local_f8._0_16_ = (undefined1  [16])0x0;
  local_b0 = 0;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,0);
  sVar15 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    sVar15 = uStack_8c;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,sVar15);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8,&local_79);
  b._M_extent._M_extent_value = (long)puStack_1a0 - (long)local_1a8;
  b._M_ptr = (pointer)local_1a8;
  ppVar8 = &CScript::operator<<((CScript *)local_a8,b)->super_CScriptBase;
  uVar14 = ppVar8->_size;
  uVar2 = uVar14 - 0x1d;
  if (uVar14 < 0x1d) {
    uVar2 = uVar14;
  }
  ppVar16 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar8->_union).indirect_contents.indirect;
  if (uVar14 < 0x1d) {
    ppVar16 = ppVar8;
  }
  local_118[0] = (readonly_property<bool>)0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar8,(uchar *)((long)&ppVar16->_union + (long)(int)uVar2),local_118);
  if (local_1a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1a8,local_198._0_8_ - (long)local_1a8);
  }
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xe5;
  file.m_begin = (iterator)&local_208;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_218,msg);
  bVar6 = ExtractDestination((CScript *)local_a8,(CTxDestination *)&local_f8._M_first);
  local_118[0] = !bVar6;
  local_118._8_8_ = (element_type *)0x0;
  sStack_108.pi_ = (sp_counted_base *)0x0;
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x48;
  local_1c8._1_1_ = 0x4f;
  local_1c8._2_1_ = 0xea;
  local_1c8._3_1_ = 0;
  local_1c8._4_1_ = 0;
  local_1c8._5_1_ = 0;
  local_1c8._6_1_ = 0;
  local_1c8._7_1_ = 0;
  local_1c8.m_message.px._0_1_ = 0x67;
  local_1c8.m_message.px._1_1_ = 0x4f;
  local_1c8.m_message.px._2_1_ = 0xea;
  local_1c8.m_message.px._3_1_ = 0;
  local_1c8.m_message.px._4_1_ = 0;
  local_1c8.m_message.px._5_1_ = 0;
  local_1c8.m_message.px._6_1_ = 0;
  local_1c8.m_message.px._7_1_ = 0;
  puStack_1a0._0_1_ = false;
  local_1a8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_198._8_8_ = &local_1c8;
  local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_220 = "";
  pvVar17 = (iterator)0x1;
  pvVar18 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_118,(lazy_ostream *)local_1a8,1,0,WARN,_cVar28,
             (size_t)&local_228,0xe5);
  boost::detail::shared_count::~shared_count((shared_count *)(local_118 + 0x10));
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xe6;
  file_00.m_begin = (iterator)&local_238;
  msg_00.m_end = pvVar18;
  msg_00.m_begin = pvVar17;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_248,
             msg_00);
  a = std::
      get<1ul,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  *)&local_f8._M_first);
  memcpy((CPubKey *)local_1a8,&local_79,0x41);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)::operator==(&a->m_pubkey,(CPubKey *)local_1a8);
  local_1c8.m_message.px._0_1_ = 0;
  local_1c8.m_message.px._1_1_ = 0;
  local_1c8.m_message.px._2_1_ = 0;
  local_1c8.m_message.px._3_1_ = 0;
  local_1c8.m_message.px._4_1_ = 0;
  local_1c8.m_message.px._5_1_ = 0;
  local_1c8.m_message.px._6_1_ = 0;
  local_1c8.m_message.px._7_1_ = 0;
  local_1c8.m_message.pn.pi_._0_1_ = '\0';
  local_1c8.m_message.pn.pi_._1_1_ = '\0';
  local_1c8.m_message.pn.pi_._2_1_ = '\0';
  local_1c8.m_message.pn.pi_._3_1_ = '\0';
  local_1c8.m_message.pn.pi_._4_1_ = 0;
  local_1c8.m_message.pn.pi_._5_1_ = 0;
  local_1c8.m_message.pn.pi_._6_1_ = 0;
  local_1c8.m_message.pn.pi_._7_1_ = 0;
  _local_1e8 = (undefined **)0xea4f68;
  _auStack_1e0 = (element_type *)0xea4fa9;
  local_118._8_8_ = local_118._9_8_ << 8;
  local_118._0_8_ = &PTR__lazy_ostream_01389048;
  sStack_108.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_250 = "";
  pvVar17 = (iterator)0x1;
  pvVar18 = (iterator)0x0;
  local_100 = local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_118,1,0,WARN,_cVar28,(size_t)&local_258,0xe6);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,0);
  sVar15 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    sVar15 = uStack_8c;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,sVar15);
  uVar14 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    uVar14 = uStack_8c;
  }
  ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8._0_8_;
  if (uStack_8c < 0x1d) {
    ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8;
  }
  local_1a8[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x76;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,
             (uchar *)((long)&ppVar8->_union + (long)(int)uVar14),local_1a8);
  uVar14 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    uVar14 = uStack_8c;
  }
  ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8._0_8_;
  if (uStack_8c < 0x1d) {
    ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8;
  }
  local_1a8[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0xa9;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,
             (uchar *)((long)&ppVar8->_union + (long)(int)uVar14),local_1a8);
  CPubKey::GetID((CKeyID *)local_118,&local_79);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_1a8,local_118,
             (uchar *)((long)&sStack_108.pi_ + 4),(allocator_type *)&local_1c8);
  b_00._M_extent._M_extent_value = (long)puStack_1a0 - (long)local_1a8;
  b_00._M_ptr = (pointer)local_1a8;
  ppVar8 = &CScript::operator<<((CScript *)local_a8,b_00)->super_CScriptBase;
  uVar14 = ppVar8->_size;
  uVar2 = uVar14 - 0x1d;
  if (uVar14 < 0x1d) {
    uVar2 = uVar14;
  }
  ppVar16 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar8->_union).indirect_contents.indirect;
  if (uVar14 < 0x1d) {
    ppVar16 = ppVar8;
  }
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x88;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar8,(uchar *)((long)&ppVar16->_union + (long)(int)uVar2),(uchar *)&local_1c8);
  uVar14 = ppVar8->_size;
  uVar2 = uVar14 - 0x1d;
  if (uVar14 < 0x1d) {
    uVar2 = uVar14;
  }
  ppVar16 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar8->_union).indirect_contents.indirect;
  if (uVar14 < 0x1d) {
    ppVar16 = ppVar8;
  }
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar8,(uchar *)((long)&ppVar16->_union + (long)(int)uVar2),(uchar *)&local_1c8);
  if (local_1a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1a8,local_198._0_8_ - (long)local_1a8);
  }
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xeb;
  file_01.m_begin = (iterator)&local_268;
  msg_01.m_end = pvVar18;
  msg_01.m_begin = pvVar17;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_278,
             msg_01);
  rVar7.super_class_property<bool>.value =
       (class_property<bool>)
       ExtractDestination((CScript *)local_a8,(CTxDestination *)&local_f8._M_first);
  local_118._8_8_ = (element_type *)0x0;
  sStack_108.pi_ = (sp_counted_base *)0x0;
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x49;
  local_1c8._1_1_ = 'O';
  local_1c8._2_1_ = 0xea;
  local_1c8._3_1_ = '\0';
  local_1c8._4_1_ = '\0';
  local_1c8._5_1_ = '\0';
  local_1c8._6_1_ = '\0';
  local_1c8._7_1_ = '\0';
  local_1c8.m_message.px._0_1_ = 'g';
  local_1c8.m_message.px._1_1_ = 'O';
  local_1c8.m_message.px._2_1_ = 0xea;
  local_1c8.m_message.px._3_1_ = '\0';
  local_1c8.m_message.px._4_1_ = '\0';
  local_1c8.m_message.px._5_1_ = '\0';
  local_1c8.m_message.px._6_1_ = '\0';
  local_1c8.m_message.px._7_1_ = '\0';
  puStack_1a0._0_1_ = false;
  local_1a8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_280 = "";
  pvVar17 = (iterator)0x1;
  pvVar18 = (iterator)0x0;
  local_118[0] = rVar7.super_class_property<bool>.value;
  local_198._8_8_ = &local_1c8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_118,(lazy_ostream *)local_1a8,1,0,WARN,_cVar28,
             (size_t)&local_288,0xeb);
  boost::detail::shared_count::~shared_count((shared_count *)(local_118 + 0x10));
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xec;
  file_02.m_begin = (iterator)&local_298;
  msg_02.m_end = pvVar18;
  msg_02.m_begin = pvVar17;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2a8,
             msg_02);
  pvVar9 = std::
           get<2ul,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                     ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_f8._M_first);
  PKHash::PKHash((PKHash *)&local_1c8,&local_79);
  uVar1 = *(undefined4 *)
           ((pvVar9->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems + 0x10);
  auVar20[0] = -((readonly_property<bool>)
                 (pvVar9->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[0]
                == local_1c8.p_predicate_value.super_readonly_property<bool>.
                   super_class_property<bool>.value);
  auVar20[1] = -((pvVar9->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[1]
                == local_1c8._1_1_);
  auVar20[2] = -((pvVar9->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[2]
                == local_1c8._2_1_);
  auVar20[3] = -((pvVar9->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[3]
                == local_1c8._3_1_);
  auVar20[4] = -((pvVar9->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[4]
                == local_1c8._4_1_);
  auVar20[5] = -((pvVar9->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[5]
                == local_1c8._5_1_);
  auVar20[6] = -((pvVar9->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[6]
                == local_1c8._6_1_);
  auVar20[7] = -((pvVar9->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[7]
                == local_1c8._7_1_);
  auVar20[8] = -((pvVar9->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[8]
                == (uchar)local_1c8.m_message.px);
  auVar20[9] = -((pvVar9->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[9]
                == local_1c8.m_message.px._1_1_);
  auVar20[10] = -((pvVar9->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[10]
                 == local_1c8.m_message.px._2_1_);
  auVar20[0xb] = -((pvVar9->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                   [0xb] == local_1c8.m_message.px._3_1_);
  auVar20[0xc] = -((pvVar9->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                   [0xc] == local_1c8.m_message.px._4_1_);
  auVar20[0xd] = -((pvVar9->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                   [0xd] == local_1c8.m_message.px._5_1_);
  auVar20[0xe] = -((pvVar9->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                   [0xe] == local_1c8.m_message.px._6_1_);
  auVar20[0xf] = -((pvVar9->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                   [0xf] == local_1c8.m_message.px._7_1_);
  auVar25[0] = -((uchar)local_1c8.m_message.pn.pi_ == (char)uVar1);
  auVar25[1] = -(local_1c8.m_message.pn.pi_._1_1_ == (char)((uint)uVar1 >> 8));
  auVar25[2] = -(local_1c8.m_message.pn.pi_._2_1_ == (char)((uint)uVar1 >> 0x10));
  auVar25[3] = -(local_1c8.m_message.pn.pi_._3_1_ == (char)((uint)uVar1 >> 0x18));
  auVar25[4] = 0xff;
  auVar25[5] = 0xff;
  auVar25[6] = 0xff;
  auVar25[7] = 0xff;
  auVar25[8] = 0xff;
  auVar25[9] = 0xff;
  auVar25[10] = 0xff;
  auVar25[0xb] = 0xff;
  auVar25[0xc] = 0xff;
  auVar25[0xd] = 0xff;
  auVar25[0xe] = 0xff;
  auVar25[0xf] = 0xff;
  auVar20 = auVar20 & auVar25;
  local_118[0] = (ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff;
  local_118._8_8_ = (element_type *)0x0;
  sStack_108.pi_ = (sp_counted_base *)0x0;
  _local_1e8 = (undefined **)0xea4faa;
  _auStack_1e0 = (element_type *)0xea4fd5;
  puStack_1a0._0_1_ = false;
  local_1a8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_198._8_8_ = local_1e8;
  local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2b0 = "";
  pvVar17 = (iterator)0x1;
  pvVar18 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_118,(lazy_ostream *)local_1a8,1,0,WARN,_cVar28,
             (size_t)&local_2b8,0xec);
  boost::detail::shared_count::~shared_count((shared_count *)(local_118 + 0x10));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_118,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,0);
  sVar15 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    sVar15 = uStack_8c;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,sVar15);
  uVar14 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    uVar14 = uStack_8c;
  }
  ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8._0_8_;
  if (uStack_8c < 0x1d) {
    ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8;
  }
  local_1a8[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0xa9;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,
             (uchar *)((long)&ppVar8->_union + (long)(int)uVar14),local_1a8);
  CScriptID::CScriptID((CScriptID *)&local_1c8,(CScript *)local_118);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_1a8,(uchar *)&local_1c8,
             (uchar *)((long)&local_1c8.m_message.pn.pi_ + 4),(allocator_type *)local_1e8);
  b_01._M_extent._M_extent_value = (long)puStack_1a0 - (long)local_1a8;
  b_01._M_ptr = (pointer)local_1a8;
  ppVar8 = &CScript::operator<<((CScript *)local_a8,b_01)->super_CScriptBase;
  uVar14 = ppVar8->_size;
  uVar2 = uVar14 - 0x1d;
  if (uVar14 < 0x1d) {
    uVar2 = uVar14;
  }
  ppVar16 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar8->_union).indirect_contents.indirect;
  if (uVar14 < 0x1d) {
    ppVar16 = ppVar8;
  }
  _local_1e8 = (undefined **)CONCAT71(stack0xfffffffffffffe19,(readonly_property<bool>)0x87);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar8,(uchar *)((long)&ppVar16->_union + (long)(int)uVar2),local_1e8);
  if (local_1a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1a8,local_198._0_8_ - (long)local_1a8);
  }
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xf2;
  file_03.m_begin = (iterator)&local_2c8;
  msg_03.m_end = pvVar18;
  msg_03.m_begin = pvVar17;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2d8,
             msg_03);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ExtractDestination((CScript *)local_a8,(CTxDestination *)&local_f8._M_first);
  local_1c8.m_message.px._0_1_ = 0;
  local_1c8.m_message.px._1_1_ = 0;
  local_1c8.m_message.px._2_1_ = 0;
  local_1c8.m_message.px._3_1_ = 0;
  local_1c8.m_message.px._4_1_ = 0;
  local_1c8.m_message.px._5_1_ = 0;
  local_1c8.m_message.px._6_1_ = 0;
  local_1c8.m_message.px._7_1_ = 0;
  local_1c8.m_message.pn.pi_._0_1_ = 0;
  local_1c8.m_message.pn.pi_._1_1_ = 0;
  local_1c8.m_message.pn.pi_._2_1_ = 0;
  local_1c8.m_message.pn.pi_._3_1_ = 0;
  local_1c8.m_message.pn.pi_._4_1_ = 0;
  local_1c8.m_message.pn.pi_._5_1_ = 0;
  local_1c8.m_message.pn.pi_._6_1_ = 0;
  local_1c8.m_message.pn.pi_._7_1_ = 0;
  _local_1e8 = (undefined **)0xea4f49;
  _auStack_1e0 = (element_type *)0xea4f67;
  puStack_1a0._0_1_ = false;
  local_1a8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2e0 = "";
  pvVar17 = (iterator)0x1;
  pvVar18 = (iterator)0x0;
  local_198._8_8_ = local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar28,(size_t)&local_2e8,0xf2);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xf3;
  file_04.m_begin = (iterator)&local_2f8;
  msg_04.m_end = pvVar18;
  msg_04.m_begin = pvVar17;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_308,
             msg_04);
  paVar10 = (allocator_type *)
            std::
            get<3ul,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                      ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        *)&local_f8._M_first);
  ScriptHash::ScriptHash((ScriptHash *)local_1e8,(CScript *)local_118);
  auVar23[0] = -(local_1e8[0] == (bool)*(class_property<bool> *)paVar10);
  auVar23[1] = -(local_1e8[1] == paVar10[1]);
  auVar23[2] = -(aStack_1e6 == paVar10[2]);
  auVar23[3] = -(aStack_1e5 == paVar10[3]);
  auVar23[4] = -(aStack_1e4 == paVar10[4]);
  auVar23[5] = -(aStack_1e3 == paVar10[5]);
  auVar23[6] = -(aStack_1e2 == paVar10[6]);
  auVar23[7] = -(aStack_1e1 == paVar10[7]);
  auVar23[8] = -(auStack_1e0[0] == paVar10[8]);
  auVar23[9] = -(auStack_1e0[1] == paVar10[9]);
  auVar23[10] = -(aStack_1de == paVar10[10]);
  auVar23[0xb] = -(aStack_1dd == paVar10[0xb]);
  auVar23[0xc] = -(aStack_1dc == paVar10[0xc]);
  auVar23[0xd] = -(aStack_1db == paVar10[0xd]);
  auVar23[0xe] = -(aStack_1da == paVar10[0xe]);
  auVar23[0xf] = -(aStack_1d9 == paVar10[0xf]);
  uVar1 = *(undefined4 *)(paVar10 + 0x10);
  auVar26[0] = -(auStack_1e0[8] == (char)uVar1);
  auVar26[1] = -(auStack_1e0[9] == (char)((uint)uVar1 >> 8));
  auVar26[2] = -(auStack_1e0[10] == (char)((uint)uVar1 >> 0x10));
  auVar26[3] = -(auStack_1e0[0xb] == (char)((uint)uVar1 >> 0x18));
  auVar26[4] = 0xff;
  auVar26[5] = 0xff;
  auVar26[6] = 0xff;
  auVar26[7] = 0xff;
  auVar26[8] = 0xff;
  auVar26[9] = 0xff;
  auVar26[10] = 0xff;
  auVar26[0xb] = 0xff;
  auVar26[0xc] = 0xff;
  auVar26[0xd] = 0xff;
  auVar26[0xe] = 0xff;
  auVar26[0xf] = 0xff;
  auVar26 = auVar26 & auVar23;
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) | (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) == 0xffff);
  local_1c8.m_message.px._0_1_ = 0;
  local_1c8.m_message.px._1_1_ = 0;
  local_1c8.m_message.px._2_1_ = 0;
  local_1c8.m_message.px._3_1_ = 0;
  local_1c8.m_message.px._4_1_ = 0;
  local_1c8.m_message.px._5_1_ = 0;
  local_1c8.m_message.px._6_1_ = 0;
  local_1c8.m_message.px._7_1_ = 0;
  local_1c8.m_message.pn.pi_._0_1_ = 0;
  local_1c8.m_message.pn.pi_._1_1_ = 0;
  local_1c8.m_message.pn.pi_._2_1_ = 0;
  local_1c8.m_message.pn.pi_._3_1_ = 0;
  local_1c8.m_message.pn.pi_._4_1_ = 0;
  local_1c8.m_message.pn.pi_._5_1_ = 0;
  local_1c8.m_message.pn.pi_._6_1_ = 0;
  local_1c8.m_message.pn.pi_._7_1_ = 0;
  local_4a0._0_8_ = "std::get<ScriptHash>(address) == ScriptHash(redeemScript)";
  local_4a0.m_message.px = (element_type *)0xea500f;
  puStack_1a0._0_1_ = false;
  local_1a8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_198._8_8_ = &local_4a0;
  local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_310 = "";
  pvVar17 = (iterator)0x1;
  pvVar18 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar28,(size_t)&local_318,0xf3);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,0);
  sVar15 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    sVar15 = uStack_8c;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,sVar15);
  uVar14 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    uVar14 = uStack_8c;
  }
  ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8._0_8_;
  if (uStack_8c < 0x1d) {
    ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8;
  }
  local_1a8[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,
             (uchar *)((long)&ppVar8->_union + (long)(int)uVar14),local_1a8);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8,&local_79);
  b_02._M_extent._M_extent_value = (long)puStack_1a0 - (long)local_1a8;
  b_02._M_ptr = (pointer)local_1a8;
  ppVar8 = &CScript::operator<<((CScript *)local_a8,b_02)->super_CScriptBase;
  uVar14 = ppVar8->_size;
  uVar2 = uVar14 - 0x1d;
  if (uVar14 < 0x1d) {
    uVar2 = uVar14;
  }
  ppVar16 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar8->_union).indirect_contents.indirect;
  if (uVar14 < 0x1d) {
    ppVar16 = ppVar8;
  }
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar8,(uchar *)((long)&ppVar16->_union + (long)(int)uVar2),(uchar *)&local_1c8);
  uVar14 = ppVar8->_size;
  uVar2 = uVar14 - 0x1d;
  if (uVar14 < 0x1d) {
    uVar2 = uVar14;
  }
  ppVar16 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar8->_union).indirect_contents.indirect;
  if (uVar14 < 0x1d) {
    ppVar16 = ppVar8;
  }
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xae;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar8,(uchar *)((long)&ppVar16->_union + (long)(int)uVar2),(uchar *)&local_1c8);
  if (local_1a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1a8,local_198._0_8_ - (long)local_1a8);
  }
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xf8;
  file_05.m_begin = (iterator)&local_328;
  msg_05.m_end = pvVar18;
  msg_05.m_begin = pvVar17;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_338,
             msg_05);
  bVar6 = ExtractDestination((CScript *)local_a8,(CTxDestination *)&local_f8._M_first);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar6;
  local_1c8.m_message.px._0_1_ = 0;
  local_1c8.m_message.px._1_1_ = 0;
  local_1c8.m_message.px._2_1_ = 0;
  local_1c8.m_message.px._3_1_ = 0;
  local_1c8.m_message.px._4_1_ = 0;
  local_1c8.m_message.px._5_1_ = 0;
  local_1c8.m_message.px._6_1_ = 0;
  local_1c8.m_message.px._7_1_ = 0;
  local_1c8.m_message.pn.pi_._0_1_ = 0;
  local_1c8.m_message.pn.pi_._1_1_ = 0;
  local_1c8.m_message.pn.pi_._2_1_ = 0;
  local_1c8.m_message.pn.pi_._3_1_ = 0;
  local_1c8.m_message.pn.pi_._4_1_ = 0;
  local_1c8.m_message.pn.pi_._5_1_ = 0;
  local_1c8.m_message.pn.pi_._6_1_ = 0;
  local_1c8.m_message.pn.pi_._7_1_ = 0;
  _local_1e8 = (undefined **)0xea4f48;
  _auStack_1e0 = (element_type *)0xea4f67;
  puStack_1a0._0_1_ = false;
  local_1a8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_198._8_8_ = (ScriptHash *)local_1e8;
  local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_340 = "";
  pvVar17 = (iterator)0x1;
  pvVar18 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar28,(size_t)&local_348,0xf8);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,0);
  sVar15 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    sVar15 = uStack_8c;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,sVar15);
  uVar14 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    uVar14 = uStack_8c;
  }
  ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8._0_8_;
  if (uStack_8c < 0x1d) {
    ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8;
  }
  local_1a8[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x6a;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,
             (uchar *)((long)&ppVar8->_union + (long)(int)uVar14),local_1a8);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x4b;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_1c8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8,__l,
             (allocator_type *)local_1e8);
  b_03._M_extent._M_extent_value = (long)puStack_1a0 - (long)local_1a8;
  b_03._M_ptr = (pointer)local_1a8;
  CScript::operator<<((CScript *)local_a8,b_03);
  if (local_1a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1a8,local_198._0_8_ - (long)local_1a8);
  }
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xfd;
  file_06.m_begin = (iterator)&local_358;
  msg_06.m_end = pvVar18;
  msg_06.m_begin = pvVar17;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_368,
             msg_06);
  bVar6 = ExtractDestination((CScript *)local_a8,(CTxDestination *)&local_f8._M_first);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar6;
  local_1c8.m_message.px._0_1_ = 0;
  local_1c8.m_message.px._1_1_ = 0;
  local_1c8.m_message.px._2_1_ = 0;
  local_1c8.m_message.px._3_1_ = 0;
  local_1c8.m_message.px._4_1_ = 0;
  local_1c8.m_message.px._5_1_ = 0;
  local_1c8.m_message.px._6_1_ = 0;
  local_1c8.m_message.px._7_1_ = 0;
  local_1c8.m_message.pn.pi_._0_1_ = 0;
  local_1c8.m_message.pn.pi_._1_1_ = 0;
  local_1c8.m_message.pn.pi_._2_1_ = 0;
  local_1c8.m_message.pn.pi_._3_1_ = 0;
  local_1c8.m_message.pn.pi_._4_1_ = 0;
  local_1c8.m_message.pn.pi_._5_1_ = 0;
  local_1c8.m_message.pn.pi_._6_1_ = 0;
  local_1c8.m_message.pn.pi_._7_1_ = 0;
  _local_1e8 = (undefined **)0xea4f48;
  _auStack_1e0 = (element_type *)0xea4f67;
  puStack_1a0._0_1_ = false;
  local_1a8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_198._8_8_ = (allocator_type *)local_1e8;
  local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_370 = "";
  pvVar17 = (iterator)0x1;
  pvVar18 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar28,(size_t)&local_378,0xfd);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,0);
  sVar15 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    sVar15 = uStack_8c;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,sVar15);
  uVar14 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    uVar14 = uStack_8c;
  }
  ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8._0_8_;
  if (uStack_8c < 0x1d) {
    ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8;
  }
  auVar3[0xf] = 0;
  auVar3._0_15_ = stack0xfffffffffffffe59;
  _local_1a8 = (lazy_ostream)(auVar3 << 8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,
             (uchar *)((long)&ppVar8->_union + (long)(int)uVar14),local_1a8);
  CPubKey::GetID((CKeyID *)&local_1c8,&local_79);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_1a8,(uchar *)&local_1c8,
             (uchar *)((long)&local_1c8.m_message.pn.pi_ + 4),(allocator_type *)local_1e8);
  b_04._M_extent._M_extent_value = (long)puStack_1a0 - (long)local_1a8;
  b_04._M_ptr = (pointer)local_1a8;
  CScript::operator<<((CScript *)local_a8,b_04);
  if (local_1a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1a8,local_198._0_8_ - (long)local_1a8);
  }
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x102;
  file_07.m_begin = (iterator)&local_388;
  msg_07.m_end = pvVar18;
  msg_07.m_begin = pvVar17;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_398,
             msg_07);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ExtractDestination((CScript *)local_a8,(CTxDestination *)&local_f8._M_first);
  local_1c8.m_message.px._0_1_ = 0;
  local_1c8.m_message.px._1_1_ = 0;
  local_1c8.m_message.px._2_1_ = 0;
  local_1c8.m_message.px._3_1_ = 0;
  local_1c8.m_message.px._4_1_ = 0;
  local_1c8.m_message.px._5_1_ = 0;
  local_1c8.m_message.px._6_1_ = 0;
  local_1c8.m_message.px._7_1_ = 0;
  local_1c8.m_message.pn.pi_._0_1_ = 0;
  local_1c8.m_message.pn.pi_._1_1_ = 0;
  local_1c8.m_message.pn.pi_._2_1_ = 0;
  local_1c8.m_message.pn.pi_._3_1_ = 0;
  local_1c8.m_message.pn.pi_._4_1_ = 0;
  local_1c8.m_message.pn.pi_._5_1_ = 0;
  local_1c8.m_message.pn.pi_._6_1_ = 0;
  local_1c8.m_message.pn.pi_._7_1_ = 0;
  _local_1e8 = (undefined **)0xea4f49;
  _auStack_1e0 = (element_type *)0xea4f67;
  puStack_1a0._0_1_ = false;
  local_1a8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_198._8_8_ = (allocator_type *)local_1e8;
  local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3a0 = "";
  pvVar17 = (iterator)0x1;
  pvVar18 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar28,(size_t)&local_3a8,0x102);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  local_138 = (undefined1  [16])0x0;
  local_128 = 0;
  local_158 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_178 = (undefined1  [16])0x0;
  local_188 = (undefined1  [16])0x0;
  local_198 = (undefined1  [16])0x0;
  local_1a8 = (undefined1  [8])0x0;
  puStack_1a0._0_1_ = false;
  puStack_1a0._1_7_ = 0;
  local_148 = 0;
  CSHA256::CSHA256((CSHA256 *)local_1a8);
  len = 0x21;
  if ((local_79.vch[0] & 0xfe) != 2) {
    if ((byte)(local_79.vch[0] - 4) < 4) {
      len = *(size_t *)(&DAT_00e3c9f0 + (ulong)(byte)(local_79.vch[0] - 4) * 8);
    }
    else {
      len = 0;
    }
  }
  CSHA256::Write((CSHA256 *)local_1a8,local_79.vch,len);
  output.m_size = 0x14;
  output.m_data = local_138;
  CHash160::Finalize((CHash160 *)local_1a8,output);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x105;
  file_08.m_begin = (iterator)&local_3b8;
  msg_08.m_end = pvVar18;
  msg_08.m_begin = pvVar17;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3c8,
             msg_08);
  pvVar11 = std::
            get<5ul,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                      ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        *)&local_f8._M_first);
  uVar1 = *(undefined4 *)
           ((pvVar11->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems + 0x10);
  auVar21[0] = -((pvVar11->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[0]
                == local_138[0]);
  auVar21[1] = -((pvVar11->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[1]
                == local_138[1]);
  auVar21[2] = -((pvVar11->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[2]
                == local_138[2]);
  auVar21[3] = -((pvVar11->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[3]
                == local_138[3]);
  auVar21[4] = -((pvVar11->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[4]
                == local_138[4]);
  auVar21[5] = -((pvVar11->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[5]
                == local_138[5]);
  auVar21[6] = -((pvVar11->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[6]
                == local_138[6]);
  auVar21[7] = -((pvVar11->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[7]
                == local_138[7]);
  auVar21[8] = -((pvVar11->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[8]
                == local_138[8]);
  auVar21[9] = -((pvVar11->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[9]
                == local_138[9]);
  auVar21[10] = -((pvVar11->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                  [10] == local_138[10]);
  auVar21[0xb] = -((pvVar11->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                   [0xb] == local_138[0xb]);
  auVar21[0xc] = -((pvVar11->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                   [0xc] == local_138[0xc]);
  auVar21[0xd] = -((pvVar11->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                   [0xd] == local_138[0xd]);
  auVar21[0xe] = -((pvVar11->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                   [0xe] == local_138[0xe]);
  auVar21[0xf] = -((pvVar11->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                   [0xf] == local_138[0xf]);
  auVar27[0] = -((char)local_128 == (char)uVar1);
  auVar27[1] = -((char)((uint)local_128 >> 8) == (char)((uint)uVar1 >> 8));
  auVar27[2] = -((char)((uint)local_128 >> 0x10) == (char)((uint)uVar1 >> 0x10));
  auVar27[3] = -((char)((uint)local_128 >> 0x18) == (char)((uint)uVar1 >> 0x18));
  auVar27[4] = 0xff;
  auVar27[5] = 0xff;
  auVar27[6] = 0xff;
  auVar27[7] = 0xff;
  auVar27[8] = 0xff;
  auVar27[9] = 0xff;
  auVar27[10] = 0xff;
  auVar27[0xb] = 0xff;
  auVar27[0xc] = 0xff;
  auVar27[0xd] = 0xff;
  auVar27[0xe] = 0xff;
  auVar27[0xf] = 0xff;
  auVar21 = auVar21 & auVar27;
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff);
  local_1c8.m_message.px._0_1_ = 0;
  local_1c8.m_message.px._1_1_ = 0;
  local_1c8.m_message.px._2_1_ = 0;
  local_1c8.m_message.px._3_1_ = 0;
  local_1c8.m_message.px._4_1_ = 0;
  local_1c8.m_message.px._5_1_ = 0;
  local_1c8.m_message.px._6_1_ = 0;
  local_1c8.m_message.px._7_1_ = 0;
  local_1c8.m_message.pn.pi_._0_1_ = 0;
  local_1c8.m_message.pn.pi_._1_1_ = 0;
  local_1c8.m_message.pn.pi_._2_1_ = 0;
  local_1c8.m_message.pn.pi_._3_1_ = 0;
  local_1c8.m_message.pn.pi_._4_1_ = 0;
  local_1c8.m_message.pn.pi_._5_1_ = 0;
  local_1c8.m_message.pn.pi_._6_1_ = 0;
  local_1c8.m_message.pn.pi_._7_1_ = 0;
  _local_1e8 = (undefined **)0xea5010;
  _auStack_1e0 = (element_type *)0xea503e;
  puStack_1a0._0_1_ = false;
  local_1a8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3d0 = "";
  pvVar17 = (iterator)0x1;
  pvVar18 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar28,(size_t)&local_3d8,0x105);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,0);
  sVar15 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    sVar15 = uStack_8c;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,sVar15);
  local_1c8.m_message.pn.pi_._0_1_ = '\0';
  local_1c8.m_message.pn.pi_._1_1_ = '\0';
  local_1c8.m_message.pn.pi_._2_1_ = '\0';
  local_1c8.m_message.pn.pi_._3_1_ = '\0';
  local_1c8.m_message.pn.pi_._4_1_ = '\0';
  local_1c8.m_message.pn.pi_._5_1_ = '\0';
  local_1c8.m_message.pn.pi_._6_1_ = '\0';
  local_1c8.m_message.pn.pi_._7_1_ = '\0';
  uStack_1b0 = '\0';
  uStack_1af = '\0';
  uStack_1ae = '\0';
  uStack_1ad = '\0';
  uStack_1ac = '\0';
  uStack_1ab = '\0';
  uStack_1aa = '\0';
  uStack_1a9 = '\0';
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_1c8._1_1_ = '\0';
  local_1c8._2_1_ = '\0';
  local_1c8._3_1_ = '\0';
  local_1c8._4_1_ = '\0';
  local_1c8._5_1_ = '\0';
  local_1c8._6_1_ = '\0';
  local_1c8._7_1_ = '\0';
  local_1c8.m_message.px._0_1_ = '\0';
  local_1c8.m_message.px._1_1_ = '\0';
  local_1c8.m_message.px._2_1_ = '\0';
  local_1c8.m_message.px._3_1_ = '\0';
  local_1c8.m_message.px._4_1_ = '\0';
  local_1c8.m_message.px._5_1_ = '\0';
  local_1c8.m_message.px._6_1_ = '\0';
  local_1c8.m_message.px._7_1_ = '\0';
  CSHA256::CSHA256((CSHA256 *)local_1a8);
  uVar14 = local_100._4_4_ - 0x1d;
  data = (CScript *)local_118._0_8_;
  if (local_100._4_4_ < 0x1d) {
    uVar14 = local_100._4_4_;
    data = (CScript *)local_118;
  }
  this_00 = CSHA256::Write((CSHA256 *)local_1a8,(uchar *)data,(ulong)uVar14);
  CSHA256::Finalize(this_00,(uchar *)&local_1c8);
  uVar14 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    uVar14 = uStack_8c;
  }
  ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8._0_8_;
  if (uStack_8c < 0x1d) {
    ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8;
  }
  auVar4[0xf] = 0;
  auVar4._0_15_ = stack0xfffffffffffffe59;
  _local_1a8 = (lazy_ostream)(auVar4 << 8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,
             (uchar *)((long)&ppVar8->_union + (long)(int)uVar14),local_1a8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_1a8,(uchar *)&local_1c8,
             local_1a8,(allocator_type *)local_1e8);
  b_05._M_extent._M_extent_value = (long)puStack_1a0 - (long)local_1a8;
  b_05._M_ptr = (pointer)local_1a8;
  CScript::operator<<((CScript *)local_a8,b_05);
  if (local_1a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1a8,local_198._0_8_ - (long)local_1a8);
  }
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x10c;
  file_09.m_begin = (iterator)&local_3e8;
  msg_09.m_end = pvVar18;
  msg_09.m_begin = pvVar17;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3f8,
             msg_09);
  rVar7.super_class_property<bool>.value =
       (class_property<bool>)
       ExtractDestination((CScript *)local_a8,(CTxDestination *)&local_f8._M_first);
  _auStack_1e0 = (element_type *)0x0;
  local_1d8.pi_ = (sp_counted_base *)0x0;
  local_4a0._0_8_ = "ExtractDestination(s, address)";
  local_4a0.m_message.px = (element_type *)0xea4f67;
  puStack_1a0._0_1_ = false;
  local_1a8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_400 = "";
  pvVar17 = (iterator)0x1;
  pvVar18 = (iterator)0x0;
  local_1e8[0] = rVar7.super_class_property<bool>.value;
  local_198._8_8_ = &local_4a0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar28,
             (size_t)&local_408,0x10c);
  boost::detail::shared_count::~shared_count((shared_count *)(auStack_1e0 + 8));
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x10d;
  file_10.m_begin = (iterator)&local_418;
  msg_10.m_end = pvVar18;
  msg_10.m_begin = pvVar17;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_428,
             msg_10);
  pvVar12 = std::
            get<4ul,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                      ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        *)&local_f8._M_first);
  auVar24[0] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                 [0x10] == (uchar)local_1c8.m_message.pn.pi_);
  auVar24[1] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                 [0x11] == local_1c8.m_message.pn.pi_._1_1_);
  auVar24[2] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                 [0x12] == local_1c8.m_message.pn.pi_._2_1_);
  auVar24[3] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                 [0x13] == local_1c8.m_message.pn.pi_._3_1_);
  auVar24[4] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                 [0x14] == local_1c8.m_message.pn.pi_._4_1_);
  auVar24[5] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                 [0x15] == local_1c8.m_message.pn.pi_._5_1_);
  auVar24[6] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                 [0x16] == local_1c8.m_message.pn.pi_._6_1_);
  auVar24[7] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                 [0x17] == local_1c8.m_message.pn.pi_._7_1_);
  auVar24[8] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                 [0x18] == uStack_1b0);
  auVar24[9] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                 [0x19] == uStack_1af);
  auVar24[10] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                  [0x1a] == uStack_1ae);
  auVar24[0xb] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                   [0x1b] == uStack_1ad);
  auVar24[0xc] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                   [0x1c] == uStack_1ac);
  auVar24[0xd] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                   [0x1d] == uStack_1ab);
  auVar24[0xe] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                   [0x1e] == uStack_1aa);
  auVar24[0xf] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                   [0x1f] == uStack_1a9);
  auVar22[0] = -((readonly_property<bool>)
                 (pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems[0]
                == local_1c8.p_predicate_value.super_readonly_property<bool>.
                   super_class_property<bool>.value);
  auVar22[1] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems[1]
                == local_1c8._1_1_);
  auVar22[2] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems[2]
                == local_1c8._2_1_);
  auVar22[3] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems[3]
                == local_1c8._3_1_);
  auVar22[4] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems[4]
                == local_1c8._4_1_);
  auVar22[5] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems[5]
                == local_1c8._5_1_);
  auVar22[6] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems[6]
                == local_1c8._6_1_);
  auVar22[7] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems[7]
                == local_1c8._7_1_);
  auVar22[8] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems[8]
                == (uchar)local_1c8.m_message.px);
  auVar22[9] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems[9]
                == local_1c8.m_message.px._1_1_);
  auVar22[10] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                  [10] == local_1c8.m_message.px._2_1_);
  auVar22[0xb] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                   [0xb] == local_1c8.m_message.px._3_1_);
  auVar22[0xc] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                   [0xc] == local_1c8.m_message.px._4_1_);
  auVar22[0xd] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                   [0xd] == local_1c8.m_message.px._5_1_);
  auVar22[0xe] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                   [0xe] == local_1c8.m_message.px._6_1_);
  auVar22[0xf] = -((pvVar12->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                   [0xf] == local_1c8.m_message.px._7_1_);
  auVar22 = auVar22 & auVar24;
  _local_1e8 = (undefined **)
               CONCAT71(stack0xfffffffffffffe19,
                        (ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                                (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) == 0xffff);
  _auStack_1e0 = (element_type *)0x0;
  local_1d8.pi_ = (sp_counted_base *)0x0;
  local_4a0._0_8_ = "std::get<WitnessV0ScriptHash>(address) == scripthash";
  local_4a0.m_message.px = (element_type *)0xea5073;
  puStack_1a0._0_1_ = false;
  local_1a8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_198._8_8_ = &local_4a0;
  local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_430 = "";
  pvVar17 = (iterator)0x1;
  pvVar18 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar28,
             (size_t)&local_438,0x10d);
  boost::detail::shared_count::~shared_count((shared_count *)(auStack_1e0 + 8));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,0);
  sVar15 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    sVar15 = uStack_8c;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,sVar15);
  uVar14 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    uVar14 = uStack_8c;
  }
  ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8._0_8_;
  if (uStack_8c < 0x1d) {
    ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8;
  }
  local_1a8[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,
             (uchar *)((long)&ppVar8->_union + (long)(int)uVar14),local_1a8);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8,&local_79);
  b_06._M_extent._M_extent_value = (long)puStack_1a0 - (long)local_1a8;
  b_06._M_ptr = (pointer)local_1a8;
  CScript::operator<<((CScript *)local_a8,b_06);
  if (local_1a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1a8,local_198._0_8_ - (long)local_1a8);
  }
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x112;
  file_11.m_begin = (iterator)&local_448;
  msg_11.m_end = pvVar18;
  msg_11.m_begin = pvVar17;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_458,
             msg_11);
  bVar6 = ExtractDestination((CScript *)local_a8,(CTxDestination *)&local_f8._M_first);
  _local_1e8 = (undefined **)CONCAT71(stack0xfffffffffffffe19,bVar6);
  _auStack_1e0 = (element_type *)0x0;
  local_1d8.pi_ = (sp_counted_base *)0x0;
  local_4a0._0_8_ = "ExtractDestination(s, address)";
  local_4a0.m_message.px = (element_type *)0xea4f67;
  puStack_1a0._0_1_ = false;
  local_1a8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
  local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_460 = "";
  pvVar17 = (iterator)0x1;
  pvVar18 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar28,
             (size_t)&local_468,0x112);
  boost::detail::shared_count::~shared_count((shared_count *)(auStack_1e0 + 8));
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e8,&local_79);
  local_1a8._0_4_ = 1;
  uVar19 = (long)_auStack_1e0 - (long)_local_1e8;
  if (uVar19 == 0) {
    __dest = (void *)0x0;
    __n = 0;
  }
  else {
    if ((long)uVar19 < 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        uVar13 = std::__throw_bad_alloc();
        boost::detail::shared_count::~shared_count(&local_4a0.m_message.pn);
        if (puStack_1a0 != (pointer)0x0) {
          operator_delete(puStack_1a0,local_198._8_8_ - (long)puStack_1a0);
        }
        if (0x1c < local_100._4_4_) {
          free((void *)local_118._0_8_);
        }
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_f8._M_first);
        if (0x1c < uStack_8c) {
          free((void *)local_a8._0_8_);
        }
        if (local_1f0._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
          SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                    ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_1f0,
                     local_1f0._M_head_impl);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          _Unwind_Resume(uVar13);
        }
      }
      goto LAB_005b5ed4;
    }
    __dest = operator_new(uVar19);
    __n = (long)_auStack_1e0 - (long)_local_1e8;
  }
  peVar5 = (element_type *)_local_1e8;
  puStack_1a0 = (pointer)__dest;
  local_198._8_8_ = uVar19 + (long)__dest;
  if (_auStack_1e0 != (element_type *)_local_1e8) {
    memmove(__dest,_local_1e8,__n);
  }
  local_198._0_8_ = __n + (long)__dest;
  if (peVar5 != (element_type *)0x0) {
    operator_delete(peVar5,(long)local_1d8.pi_ - (long)peVar5);
  }
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x114;
  file_12.m_begin = (iterator)&local_478;
  msg_12.m_end = pvVar18;
  msg_12.m_begin = pvVar17;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_488,
             msg_12);
  w1 = std::
       get<8ul,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                 ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   *)&local_f8._M_first);
  bVar6 = ::operator==(w1,(WitnessUnknown *)local_1a8);
  local_4a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar6;
  local_4a0.m_message.px = (element_type *)0x0;
  local_4a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d0 = &local_4b0;
  local_4b0 = "std::get<WitnessUnknown>(address) == unk";
  local_4a8 = "";
  _auStack_1e0 = (element_type *)(auStack_1e0._1_8_ << 8);
  _local_1e8 = &PTR__lazy_ostream_01389048;
  local_1d8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_4a0,(lazy_ostream *)local_1e8,1,0,WARN,0xea4a2f,(size_t)&stack0xfffffffffffffb40
             ,0x114);
  boost::detail::shared_count::~shared_count(&local_4a0.m_message.pn);
  if (puStack_1a0 != (pointer)0x0) {
    operator_delete(puStack_1a0,local_198._8_8_ - (long)puStack_1a0);
  }
  if (0x1c < local_100._4_4_) {
    free((void *)local_118._0_8_);
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_f8._M_first);
  if (0x1c < uStack_8c) {
    free((void *)local_a8._0_8_);
  }
  if (local_1f0._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_1f0,
               local_1f0._M_head_impl);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_005b5ed4:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(script_standard_ExtractDestination)
{
    CKey key = GenerateRandomKey();
    CPubKey pubkey = key.GetPubKey();

    CScript s;
    CTxDestination address;

    // TxoutType::PUBKEY
    s.clear();
    s << ToByteVector(pubkey) << OP_CHECKSIG;
    BOOST_CHECK(!ExtractDestination(s, address));
    BOOST_CHECK(std::get<PubKeyDestination>(address) == PubKeyDestination(pubkey));

    // TxoutType::PUBKEYHASH
    s.clear();
    s << OP_DUP << OP_HASH160 << ToByteVector(pubkey.GetID()) << OP_EQUALVERIFY << OP_CHECKSIG;
    BOOST_CHECK(ExtractDestination(s, address));
    BOOST_CHECK(std::get<PKHash>(address) == PKHash(pubkey));

    // TxoutType::SCRIPTHASH
    CScript redeemScript(s); // initialize with leftover P2PKH script
    s.clear();
    s << OP_HASH160 << ToByteVector(CScriptID(redeemScript)) << OP_EQUAL;
    BOOST_CHECK(ExtractDestination(s, address));
    BOOST_CHECK(std::get<ScriptHash>(address) == ScriptHash(redeemScript));

    // TxoutType::MULTISIG
    s.clear();
    s << OP_1 << ToByteVector(pubkey) << OP_1 << OP_CHECKMULTISIG;
    BOOST_CHECK(!ExtractDestination(s, address));

    // TxoutType::NULL_DATA
    s.clear();
    s << OP_RETURN << std::vector<unsigned char>({75});
    BOOST_CHECK(!ExtractDestination(s, address));

    // TxoutType::WITNESS_V0_KEYHASH
    s.clear();
    s << OP_0 << ToByteVector(pubkey.GetID());
    BOOST_CHECK(ExtractDestination(s, address));
    WitnessV0KeyHash keyhash;
    CHash160().Write(pubkey).Finalize(keyhash);
    BOOST_CHECK(std::get<WitnessV0KeyHash>(address) == keyhash);

    // TxoutType::WITNESS_V0_SCRIPTHASH
    s.clear();
    WitnessV0ScriptHash scripthash;
    CSHA256().Write(redeemScript.data(), redeemScript.size()).Finalize(scripthash.begin());
    s << OP_0 << ToByteVector(scripthash);
    BOOST_CHECK(ExtractDestination(s, address));
    BOOST_CHECK(std::get<WitnessV0ScriptHash>(address) == scripthash);

    // TxoutType::WITNESS_UNKNOWN with unknown version
    s.clear();
    s << OP_1 << ToByteVector(pubkey);
    BOOST_CHECK(ExtractDestination(s, address));
    WitnessUnknown unk{1, ToByteVector(pubkey)};
    BOOST_CHECK(std::get<WitnessUnknown>(address) == unk);
}